

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O1

int glu::TextureTestUtil::compareGenMipmapVeryLenient
              (ConstPixelBufferAccess *dst,ConstPixelBufferAccess *src,PixelBufferAccess *errorMask,
              GenMipmapPrecision *precision)

{
  undefined4 x;
  undefined4 uVar1;
  ulong uVar2;
  int i;
  long lVar3;
  int z;
  ulong uVar4;
  int y;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  Vector<float,_4> res;
  Vector<bool,_4> res_2;
  Vec4 sample;
  Vec4 maxVal;
  Vec4 minVal;
  Vec4 result;
  undefined8 local_c8;
  undefined8 uStack_c0;
  float local_b0;
  float local_ac;
  float local_a8;
  float local_a4;
  undefined4 local_a0;
  undefined1 local_9c [36];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 *local_58;
  ConstPixelBufferAccess *local_50;
  PixelBufferAccess *local_48;
  float local_40 [4];
  
  iVar5 = (dst->m_size).m_data[1];
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  else {
    local_a4 = (float)(dst->m_size).m_data[0];
    local_ac = (float)iVar5;
    local_a8 = (float)(src->m_size).m_data[0];
    local_b0 = (float)(src->m_size).m_data[1];
    local_58 = &local_c8;
    iVar5 = 0;
    iVar8 = 0;
    local_50 = dst;
    local_48 = errorMask;
    do {
      if (0 < (dst->m_size).m_data[0]) {
        fVar11 = floorf((((float)iVar8 + -0.5) / local_ac) * local_b0);
        iVar6 = (int)fVar11;
        fVar11 = ceilf((((float)iVar8 + 1.5) / local_ac) * local_b0);
        iVar7 = 0;
        local_9c._16_4_ = iVar8;
        do {
          local_9c._32_4_ = iVar5;
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_40,(int)dst,iVar7,iVar8);
          local_9c._24_4_ = (undefined4)iVar7;
          local_9c._28_4_ = iVar7;
          local_9c._20_4_ = floorf((((float)local_9c._24_4_ + -0.5) / local_a4) * local_a8);
          fVar12 = ceilf((((float)local_9c._24_4_ + 1.5) / local_a4) * local_a8);
          local_68 = 0;
          uStack_60 = 0;
          local_78 = 0;
          uStack_70 = 0;
          if (iVar6 <= (int)fVar11) {
            iVar7 = (int)(float)local_9c._20_4_;
            iVar8 = iVar7;
            iVar5 = iVar6;
            do {
              for (; iVar8 <= (int)fVar12; iVar8 = iVar8 + 1) {
                y = (src->m_size).m_data[0] + -1;
                if (iVar8 < y) {
                  y = iVar8;
                }
                if (iVar8 < 0) {
                  y = 0;
                }
                z = (src->m_size).m_data[1] + -1;
                if (iVar5 < z) {
                  z = iVar5;
                }
                if (iVar5 < 0) {
                  z = 0;
                }
                tcu::ConstPixelBufferAccess::getPixel
                          ((ConstPixelBufferAccess *)local_9c,(int)src,y,z);
                if ((iVar5 == iVar6) && (iVar8 == iVar7)) {
                  local_68 = CONCAT44(local_9c._4_4_,local_9c._0_4_);
                  uStack_60 = CONCAT44(local_9c._12_4_,local_9c._8_4_);
                  fVar13 = (float)local_9c._0_4_;
                  fVar14 = (float)local_9c._4_4_;
                  fVar15 = (float)local_9c._8_4_;
                  fVar16 = (float)local_9c._12_4_;
                }
                else {
                  local_c8 = 0;
                  uStack_c0 = 0;
                  lVar3 = 0;
                  do {
                    fVar13 = *(float *)((long)&local_68 + lVar3 * 4);
                    uVar10 = -(uint)(*(float *)(local_9c + lVar3 * 4) <= fVar13);
                    *(uint *)((long)&local_c8 + lVar3 * 4) =
                         ~uVar10 & (uint)fVar13 | (uint)*(float *)(local_9c + lVar3 * 4) & uVar10;
                    lVar3 = lVar3 + 1;
                  } while (lVar3 != 4);
                  local_68 = local_c8;
                  uStack_60 = uStack_c0;
                  local_c8 = 0;
                  uStack_c0 = 0;
                  lVar3 = 0;
                  do {
                    fVar13 = *(float *)((long)&local_78 + lVar3 * 4);
                    uVar10 = -(uint)(fVar13 <= *(float *)(local_9c + lVar3 * 4));
                    *(uint *)((long)&local_c8 + lVar3 * 4) =
                         ~uVar10 & (uint)fVar13 | (uint)*(float *)(local_9c + lVar3 * 4) & uVar10;
                    lVar3 = lVar3 + 1;
                  } while (lVar3 != 4);
                  fVar13 = (float)local_c8;
                  fVar14 = local_c8._4_4_;
                  fVar15 = (float)uStack_c0;
                  fVar16 = uStack_c0._4_4_;
                }
                local_78 = CONCAT44(fVar14,fVar13);
                uStack_70 = CONCAT44(fVar16,fVar15);
              }
              iVar5 = iVar5 + 1;
              iVar8 = iVar7;
            } while (iVar5 <= (int)fVar11);
          }
          uVar1 = local_9c._32_4_;
          x = local_9c._28_4_;
          local_c8 = local_c8 & 0xffffffff00000000;
          lVar3 = 0;
          do {
            *(bool *)((long)&local_c8 + lVar3) =
                 *(float *)((long)&local_68 + lVar3 * 4) <= local_40[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 4);
          local_a0 = 0;
          lVar3 = 0;
          do {
            *(bool *)((long)&local_a0 + lVar3) =
                 local_40[lVar3] <= *(float *)((long)&local_78 + lVar3 * 4);
            lVar3 = lVar3 + 1;
          } while (lVar3 != 4);
          local_9c._0_4_ = 0.0;
          lVar3 = 0;
          do {
            local_9c[lVar3] =
                 *(byte *)((long)&local_a0 + lVar3) & *(byte *)((long)&local_c8 + lVar3);
            lVar3 = lVar3 + 1;
          } while (lVar3 != 4);
          if (local_9c[0] == R) {
            bVar9 = false;
          }
          else {
            uVar2 = 0;
            do {
              uVar4 = uVar2;
              if (uVar4 == 3) break;
              uVar2 = uVar4 + 1;
            } while (local_9c[uVar4 + 1] != '\0');
            bVar9 = 2 < uVar4;
          }
          if (bVar9 == false) {
            local_c8 = CONCAT44(local_c8._4_4_,0xff0000ff);
          }
          else {
            local_c8 = CONCAT44(local_c8._4_4_,0xff00ff00);
          }
          tcu::RGBA::toVec((RGBA *)local_9c);
          iVar8 = local_9c._16_4_;
          tcu::PixelBufferAccess::setPixel(local_48,(Vec4 *)local_9c,x,local_9c._16_4_,0);
          iVar5 = uVar1 + (uint)(bVar9 ^ 1);
          iVar7 = x + 1;
          dst = local_50;
        } while (iVar7 < (local_50->m_size).m_data[0]);
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 < (dst->m_size).m_data[1]);
  }
  return iVar5;
}

Assistant:

static int compareGenMipmapVeryLenient (const tcu::ConstPixelBufferAccess& dst, const tcu::ConstPixelBufferAccess& src, const tcu::PixelBufferAccess& errorMask, const GenMipmapPrecision& precision)
{
	DE_ASSERT(dst.getDepth() == 1 && src.getDepth() == 1); // \todo [2013-10-29 pyry] 3D textures.
	DE_UNREF(precision);

	const float		dstW		= float(dst.getWidth());
	const float		dstH		= float(dst.getHeight());
	const float		srcW		= float(src.getWidth());
	const float		srcH		= float(src.getHeight());
	int				numFailed	= 0;

	for (int y = 0; y < dst.getHeight(); y++)
	for (int x = 0; x < dst.getWidth(); x++)
	{
		const tcu::Vec4	result	= dst.getPixel(x, y);
		const int		minX		= deFloorFloatToInt32(((float)x-0.5f) / dstW * srcW);
		const int		minY		= deFloorFloatToInt32(((float)y-0.5f) / dstH * srcH);
		const int		maxX		= deCeilFloatToInt32(((float)x+1.5f) / dstW * srcW);
		const int		maxY		= deCeilFloatToInt32(((float)y+1.5f) / dstH * srcH);
		tcu::Vec4		minVal, maxVal;
		bool			isOk;

		DE_ASSERT(minX < maxX && minY < maxY);

		for (int ky = minY; ky <= maxY; ky++)
		{
			for (int kx = minX; kx <= maxX; kx++)
			{
				const int		sx		= de::clamp(kx, 0, src.getWidth()-1);
				const int		sy		= de::clamp(ky, 0, src.getHeight()-1);
				const tcu::Vec4	sample	= src.getPixel(sx, sy);

				if (ky == minY && kx == minX)
				{
					minVal = sample;
					maxVal = sample;
				}
				else
				{
					minVal = min(sample, minVal);
					maxVal = max(sample, maxVal);
				}
			}
		}

		isOk = boolAll(logicalAnd(lessThanEqual(minVal, result), lessThanEqual(result, maxVal)));

		errorMask.setPixel(isOk ? tcu::RGBA::green().toVec() : tcu::RGBA::red().toVec(), x, y);
		if (!isOk)
			numFailed += 1;
	}

	return numFailed;
}